

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float afVar2 [2];
  float *pfVar3;
  Vector<float,_2> *pVVar4;
  int r;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined4 uVar9;
  Type in0;
  float local_64 [3];
  Matrix<float,_2,_4> res;
  Matrix<float,_4,_2> retVal;
  Type in1;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    afVar2 = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    afVar2[0] = 1.2;
    afVar2[1] = 0.5;
  }
  in0.m_data[0] = afVar2[0];
  in0.m_data[1] = afVar2[1];
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data[0] = (evalCtx->coords).m_data[0];
    in1.m_data[1] = (evalCtx->coords).m_data[1];
    in1.m_data[2] = (evalCtx->coords).m_data[2];
    in1.m_data[3] = (evalCtx->coords).m_data[3];
  }
  else {
    in1.m_data[0] = 0.2;
    in1.m_data[1] = -1.0;
    in1.m_data[2] = 0.5;
    in1.m_data[3] = 0.8;
  }
  pfVar3 = (float *)&retVal;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[0].m_data[3] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar7) = uVar9;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 == 0x10);
    lVar6 = lVar6 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar6 != 4);
  pfVar3 = (float *)&retVal;
  lVar5 = 0;
  do {
    fVar1 = in1.m_data[lVar5];
    lVar6 = 0;
    do {
      pfVar3[lVar6] = *(float *)((long)in0.m_data + lVar6) * fVar1;
      lVar6 = lVar6 + 4;
    } while (lVar6 == 4);
    lVar5 = lVar5 + 1;
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 4);
  pfVar3 = (float *)&res;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar5 != lVar6) {
        uVar9 = 0;
      }
      pfVar3[lVar6 * 2] = (float)uVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  pVVar4 = (Vector<float,_2> *)&res;
  pfVar3 = (float *)&retVal;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)((Vector<tcu::Vector<float,_2>,_4> *)pVVar4->m_data)->m_data[0].m_data +
                lVar6) = pfVar3[lVar6];
      lVar6 = lVar6 + 4;
    } while (lVar6 == 4);
    lVar5 = lVar5 + 1;
    pVVar4 = pVVar4 + 1;
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 4);
  retVal.m_data.m_data[0].m_data._0_8_ = &evalCtx->color;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[0].m_data[3] = 1.4013e-45;
  retVal.m_data.m_data[1].m_data[0] = 2.8026e-45;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[(int)retVal.m_data.m_data[0].m_data[lVar5]] = in0.m_data[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}